

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Atoi64(char *zNum,i64 *pNum,int length,u8 enc)

{
  byte *pbVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  undefined7 in_register_00000009;
  byte *pbVar6;
  long lVar7;
  long lVar8;
  i64 iVar9;
  byte *pbVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  byte *pbVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  bool bVar19;
  
  uVar4 = (uint)CONCAT71(in_register_00000009,enc);
  if (uVar4 == 1) {
    uVar12 = 1;
    bVar19 = false;
    pbVar6 = (byte *)zNum;
  }
  else {
    uVar12 = 2;
    for (lVar16 = (long)(int)(3 - uVar4);
        (bVar19 = lVar16 < length, lVar16 < length && (zNum[lVar16] == '\0')); lVar16 = lVar16 + 2)
    {
    }
    length = (uint)lVar16 ^ 1;
    pbVar6 = (byte *)(zNum + (uVar4 & 1));
  }
  pbVar10 = (byte *)(zNum + length);
  uVar13 = (ulong)uVar12;
  for (; bVar3 = true, pbVar6 < pbVar10; pbVar6 = pbVar6 + uVar13) {
    bVar2 = *pbVar6;
    if ((""[bVar2] & 1) == 0) {
      if (bVar2 == 0x2b) {
        pbVar6 = pbVar6 + uVar13;
      }
      else if (bVar2 == 0x2d) {
        pbVar6 = pbVar6 + uVar13;
        bVar3 = false;
      }
      break;
    }
  }
  lVar16 = 0;
  for (pbVar14 = pbVar6; (pbVar14 < pbVar10 && (*pbVar14 == 0x30)); pbVar14 = pbVar14 + uVar13) {
    lVar16 = lVar16 - uVar13;
  }
  lVar8 = 0;
  lVar15 = lVar16;
  for (lVar18 = 0; (pbVar1 = pbVar14 + lVar18, pbVar1 < pbVar10 && ((byte)(*pbVar1 - 0x30) < 10));
      lVar18 = lVar18 + uVar13) {
    lVar8 = lVar8 * 10 + (ulong)*pbVar1 + -0x30;
    lVar15 = lVar15 - uVar13;
  }
  lVar17 = -0x8000000000000000;
  lVar7 = -lVar8;
  if (bVar3) {
    lVar17 = 0x7fffffffffffffff;
    lVar7 = lVar8;
  }
  if (lVar8 < 0) {
    lVar7 = lVar17;
  }
  *pNum = lVar7;
  if (lVar18 == 0) {
    bVar19 = (bool)(bVar19 | lVar16 == 0);
    if ((bVar19 != false) || (pbVar10 <= pbVar1)) goto LAB_0013dc49;
  }
  else if (pbVar10 <= pbVar1 || bVar19 != false) goto LAB_0013dc49;
  lVar15 = -lVar15;
  do {
    bVar19 = (""[pbVar6[lVar15]] & 1) == 0;
    if (bVar19) break;
    lVar16 = lVar15 + uVar13;
    lVar15 = lVar15 + uVar13;
  } while (pbVar6 + lVar16 < pbVar10);
LAB_0013dc49:
  uVar4 = (uint)bVar19;
  if (uVar12 * 0x13 <= (uint)lVar18) {
    if (uVar12 * 0x13 < (uint)lVar18) {
      iVar5 = 1;
    }
    else {
      iVar5 = 0;
      pbVar6 = pbVar14;
      for (uVar11 = 0; (iVar5 == 0 && (uVar11 < 0x12)); uVar11 = uVar11 + 1) {
        iVar5 = ((int)(char)*pbVar6 - (int)"922337203685477580"[uVar11]) * 10;
        pbVar6 = pbVar6 + uVar13;
      }
      if (iVar5 == 0) {
        iVar5 = (char)pbVar14[uVar13 * 0x12] + -0x38;
      }
      if (iVar5 < 0) {
        return (uint)bVar19;
      }
    }
    iVar9 = -0x8000000000000000;
    if (bVar3) {
      iVar9 = 0x7fffffffffffffff;
    }
    *pNum = iVar9;
    uVar4 = (uint)bVar19;
    if (bVar3) {
      uVar4 = 3;
    }
    if (iVar5 != 0) {
      uVar4 = 2;
    }
  }
  return uVar4;
}

Assistant:

SQLITE_PRIVATE int sqlite3Atoi64(const char *zNum, i64 *pNum, int length, u8 enc){
  int incr;
  u64 u = 0;
  int neg = 0; /* assume positive */
  int i;
  int c = 0;
  int nonNum = 0;  /* True if input contains UTF16 with high byte non-zero */
  int rc;          /* Baseline return code */
  const char *zStart;
  const char *zEnd = zNum + length;
  assert( enc==SQLITE_UTF8 || enc==SQLITE_UTF16LE || enc==SQLITE_UTF16BE );
  if( enc==SQLITE_UTF8 ){
    incr = 1;
  }else{
    incr = 2;
    assert( SQLITE_UTF16LE==2 && SQLITE_UTF16BE==3 );
    for(i=3-enc; i<length && zNum[i]==0; i+=2){}
    nonNum = i<length;
    zEnd = &zNum[i^1];
    zNum += (enc&1);
  }
  while( zNum<zEnd && sqlite3Isspace(*zNum) ) zNum+=incr;
  if( zNum<zEnd ){
    if( *zNum=='-' ){
      neg = 1;
      zNum+=incr;
    }else if( *zNum=='+' ){
      zNum+=incr;
    }
  }
  zStart = zNum;
  while( zNum<zEnd && zNum[0]=='0' ){ zNum+=incr; } /* Skip leading zeros. */
  for(i=0; &zNum[i]<zEnd && (c=zNum[i])>='0' && c<='9'; i+=incr){
    u = u*10 + c - '0';
  }
  testcase( i==18*incr );
  testcase( i==19*incr );
  testcase( i==20*incr );
  if( u>LARGEST_INT64 ){
    /* This test and assignment is needed only to suppress UB warnings
    ** from clang and -fsanitize=undefined.  This test and assignment make
    ** the code a little larger and slower, and no harm comes from omitting
    ** them, but we must appaise the undefined-behavior pharisees. */
    *pNum = neg ? SMALLEST_INT64 : LARGEST_INT64;
  }else if( neg ){
    *pNum = -(i64)u;
  }else{
    *pNum = (i64)u;
  }
  rc = 0;
  if( (i==0 && zStart==zNum)     /* No digits */
   || nonNum                     /* UTF16 with high-order bytes non-zero */
  ){
    rc = 1;
  }else if( &zNum[i]<zEnd ){     /* Extra bytes at the end */
    int jj = i;
    do{
      if( !sqlite3Isspace(zNum[jj]) ){
        rc = 1;          /* Extra non-space text after the integer */
        break;
      }
      jj += incr;
    }while( &zNum[jj]<zEnd );
  }
  if( i<19*incr ){
    /* Less than 19 digits, so we know that it fits in 64 bits */
    assert( u<=LARGEST_INT64 );
    return rc;
  }else{
    /* zNum is a 19-digit numbers.  Compare it against 9223372036854775808. */
    c = i>19*incr ? 1 : compare2pow63(zNum, incr);
    if( c<0 ){
      /* zNum is less than 9223372036854775808 so it fits */
      assert( u<=LARGEST_INT64 );
      return rc;
    }else{
      *pNum = neg ? SMALLEST_INT64 : LARGEST_INT64;
      if( c>0 ){
        /* zNum is greater than 9223372036854775808 so it overflows */
        return 2;
      }else{
        /* zNum is exactly 9223372036854775808.  Fits if negative.  The
        ** special case 2 overflow if positive */
        assert( u-1==LARGEST_INT64 );
        return neg ? rc : 3;
      }
    }
  }
}